

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ops.cpp
# Opt level: O2

void ggml_compute_forward_unary(ggml_compute_params *params,ggml_tensor *dst)

{
  float fVar1;
  uint uVar2;
  int iVar3;
  size_t sVar4;
  void *pvVar5;
  ggml_tensor *pgVar6;
  size_t sVar7;
  void *pvVar8;
  int64_t iVar9;
  undefined4 uVar10;
  int iVar11;
  int iVar12;
  int i_1;
  ulong uVar13;
  undefined8 uVar14;
  int i_4;
  int i;
  ulong in_R10;
  long lVar15;
  ggml_tensor *src0_2;
  ggml_tensor *src0;
  undefined1 auVar16 [16];
  float fVar17;
  ggml_tensor *src0_1;
  
  uVar10 = ggml_get_unary_op(dst);
  switch(uVar10) {
  case 0:
    ggml_compute_forward_abs(params,dst);
    return;
  case 1:
    ggml_compute_forward_sgn(params,dst);
    return;
  case 2:
    ggml_compute_forward_neg(params,dst);
    return;
  case 3:
    ggml_compute_forward_step(params,dst);
    return;
  case 4:
    ggml_compute_forward_tanh(params,dst);
    return;
  case 5:
    ggml_compute_forward_elu(params,dst);
    return;
  case 6:
    ggml_compute_forward_relu(params,dst);
    return;
  case 7:
    ggml_compute_forward_sigmoid(params,dst);
    return;
  case 8:
    pgVar6 = dst->src[0];
    if (pgVar6->type == GGML_TYPE_F16) {
      iVar3 = params->ith;
      iVar12 = params->nth;
      uVar2 = (uint)pgVar6->ne[0];
      iVar11 = ggml_nrows(pgVar6);
      iVar12 = (iVar12 + -1 + iVar11) / iVar12;
      lVar15 = (long)iVar3 * (long)iVar12;
      iVar12 = iVar12 + (int)lVar15;
      if (iVar11 <= iVar12) {
        iVar12 = iVar11;
      }
      for (; lVar15 < iVar12; lVar15 = lVar15 + 1) {
        sVar7 = dst->nb[1];
        sVar4 = pgVar6->nb[1];
        pvVar8 = dst->data;
        pvVar5 = pgVar6->data;
        for (uVar13 = 0; (~((int)uVar2 >> 0x1f) & uVar2) != uVar13; uVar13 = uVar13 + 1) {
          *(ggml_fp16_t *)((long)pvVar8 + uVar13 * 2 + sVar7 * lVar15) =
               ggml_table_gelu_f16[*(ushort *)((long)pvVar5 + uVar13 * 2 + sVar4 * lVar15)];
        }
      }
    }
    else {
      if (pgVar6->type != GGML_TYPE_F32) {
        uVar14 = 0xa8e;
        goto LAB_00142f20;
      }
      iVar3 = params->ith;
      iVar12 = params->nth;
      uVar2 = (uint)pgVar6->ne[0];
      iVar11 = ggml_nrows(pgVar6);
      iVar12 = (iVar12 + -1 + iVar11) / iVar12;
      lVar15 = (long)iVar3 * (long)iVar12;
      iVar12 = iVar12 + (int)lVar15;
      if (iVar11 <= iVar12) {
        iVar12 = iVar11;
      }
      for (; lVar15 < iVar12; lVar15 = lVar15 + 1) {
        sVar7 = dst->nb[1];
        sVar4 = pgVar6->nb[1];
        pvVar8 = dst->data;
        pvVar5 = pgVar6->data;
        for (uVar13 = 0; (~((int)uVar2 >> 0x1f) & uVar2) != uVar13; uVar13 = uVar13 + 1) {
          fVar1 = *(float *)((long)pvVar5 + uVar13 * 4 + sVar4 * lVar15);
          fVar17 = 0.0;
          if ((-10.0 < fVar1) && (fVar17 = fVar1, fVar1 < 10.0)) {
            auVar16 = vcvtps2ph_f16c(ZEXT416((uint)fVar1),0);
            uVar10 = vpextrw_avx(auVar16,0);
            in_R10 = (ulong)ggml_table_gelu_f16[CONCAT44((int)(in_R10 >> 0x20),uVar10)];
            fVar17 = *(float *)(&ggml_table_f32_f16 + in_R10 * 4);
          }
          *(float *)((long)pvVar8 + uVar13 * 4 + sVar7 * lVar15) = fVar17;
        }
      }
    }
    break;
  case 9:
    pgVar6 = dst->src[0];
    if (pgVar6->type == GGML_TYPE_F16) {
      iVar3 = params->ith;
      iVar12 = params->nth;
      uVar2 = (uint)pgVar6->ne[0];
      iVar11 = ggml_nrows();
      iVar12 = (iVar12 + -1 + iVar11) / iVar12;
      lVar15 = (long)iVar3 * (long)iVar12;
      iVar12 = iVar12 + (int)lVar15;
      if (iVar11 <= iVar12) {
        iVar12 = iVar11;
      }
      for (; lVar15 < iVar12; lVar15 = lVar15 + 1) {
        sVar7 = pgVar6->nb[1];
        pvVar8 = pgVar6->data;
        for (uVar13 = 0; (~((int)uVar2 >> 0x1f) & uVar2) != uVar13; uVar13 = uVar13 + 1) {
          fVar1 = *(float *)(&ggml_table_f32_f16 +
                            (ulong)*(ushort *)((long)pvVar8 + uVar13 * 2 + sVar7 * lVar15) * 4);
          fVar17 = expf(fVar1 * -1.702);
          auVar16 = vcvtps2ph_f16c(ZEXT416((uint)((1.0 / (fVar17 + 1.0)) * fVar1)),0);
          vpextrw_avx(auVar16,0);
        }
      }
    }
    else {
      if (pgVar6->type != GGML_TYPE_F32) {
        uVar14 = 0xaf5;
        goto LAB_00142f20;
      }
      iVar3 = params->ith;
      iVar12 = params->nth;
      uVar2 = (uint)pgVar6->ne[0];
      iVar11 = ggml_nrows(pgVar6);
      iVar12 = (iVar12 + -1 + iVar11) / iVar12;
      lVar15 = (long)iVar3 * (long)iVar12;
      iVar12 = iVar12 + (int)lVar15;
      if (iVar11 <= iVar12) {
        iVar12 = iVar11;
      }
      for (; lVar15 < iVar12; lVar15 = lVar15 + 1) {
        sVar7 = dst->nb[1];
        sVar4 = pgVar6->nb[1];
        pvVar8 = dst->data;
        pvVar5 = pgVar6->data;
        for (uVar13 = 0; (~((int)uVar2 >> 0x1f) & uVar2) != uVar13; uVar13 = uVar13 + 1) {
          auVar16 = vcvtps2ph_f16c(ZEXT416(*(uint *)((long)pvVar5 + uVar13 * 4 + sVar4 * lVar15)),0)
          ;
          uVar10 = vpextrw_avx(auVar16,0);
          in_R10 = (ulong)ggml_table_gelu_quick_f16[CONCAT44((int)(in_R10 >> 0x20),uVar10)];
          *(undefined4 *)((long)pvVar8 + uVar13 * 4 + sVar7 * lVar15) =
               *(undefined4 *)(&ggml_table_f32_f16 + in_R10 * 4);
        }
      }
    }
    break;
  case 10:
    pgVar6 = dst->src[0];
    if (pgVar6->type == GGML_TYPE_F16) {
      iVar3 = params->ith;
      iVar12 = params->nth;
      uVar2 = (uint)pgVar6->ne[0];
      iVar11 = ggml_nrows(pgVar6);
      iVar12 = (iVar12 + -1 + iVar11) / iVar12;
      lVar15 = (long)iVar3 * (long)iVar12;
      iVar12 = iVar12 + (int)lVar15;
      if (iVar11 <= iVar12) {
        iVar12 = iVar11;
      }
      for (; lVar15 < iVar12; lVar15 = lVar15 + 1) {
        sVar7 = pgVar6->nb[1];
        pvVar8 = pgVar6->data;
        for (uVar13 = 0; (~((int)uVar2 >> 0x1f) & uVar2) != uVar13; uVar13 = uVar13 + 1) {
          fVar1 = *(float *)(&ggml_table_f32_f16 +
                            (ulong)*(ushort *)((long)pvVar8 + uVar13 * 2 + sVar7 * lVar15) * 4);
          auVar16._8_4_ = 0x80000000;
          auVar16._0_8_ = 0x8000000080000000;
          auVar16._12_4_ = 0x80000000;
          auVar16 = vxorps_avx512vl(ZEXT416((uint)fVar1),auVar16);
          fVar17 = expf(auVar16._0_4_);
          auVar16 = vcvtps2ph_f16c(ZEXT416((uint)(fVar1 / (fVar17 + 1.0))),0);
          vpextrw_avx(auVar16,0);
        }
      }
    }
    else {
      if (pgVar6->type != GGML_TYPE_F32) {
        uVar14 = 0xb5c;
        goto LAB_00142f20;
      }
      iVar3 = params->ith;
      iVar12 = params->nth;
      iVar9 = pgVar6->ne[0];
      iVar11 = ggml_nrows(pgVar6);
      iVar12 = (iVar12 + -1 + iVar11) / iVar12;
      lVar15 = (long)iVar3 * (long)iVar12;
      iVar12 = iVar12 + (int)lVar15;
      if (iVar11 <= iVar12) {
        iVar12 = iVar11;
      }
      for (; lVar15 < iVar12; lVar15 = lVar15 + 1) {
        ggml_vec_silu_f32((int)iVar9,(float *)(dst->nb[1] * lVar15 + (long)dst->data),
                          (float *)(pgVar6->nb[1] * lVar15 + (long)pgVar6->data));
      }
    }
    break;
  case 0xb:
    ggml_compute_forward_hardswish(params,dst);
    return;
  case 0xc:
    ggml_compute_forward_hardsigmoid(params,dst);
    return;
  case 0xd:
    ggml_compute_forward_exp(params,dst);
    return;
  default:
    uVar14 = 0x1e6b;
LAB_00142f20:
    ggml_abort("/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]ggml/src/ggml-cpu/ops.cpp"
               ,uVar14,"fatal error");
  }
  return;
}

Assistant:

void ggml_compute_forward_unary(
        const ggml_compute_params * params,
        ggml_tensor * dst) {

    const ggml_unary_op op = ggml_get_unary_op(dst);

    switch (op) {
        case GGML_UNARY_OP_ABS:
            {
                ggml_compute_forward_abs(params, dst);
            } break;
        case GGML_UNARY_OP_SGN:
            {
                ggml_compute_forward_sgn(params, dst);
            } break;
        case GGML_UNARY_OP_NEG:
            {
                ggml_compute_forward_neg(params, dst);
            } break;
        case GGML_UNARY_OP_STEP:
            {
                ggml_compute_forward_step(params, dst);
            } break;
        case GGML_UNARY_OP_TANH:
            {
                ggml_compute_forward_tanh(params, dst);
            } break;
        case GGML_UNARY_OP_ELU:
            {
                ggml_compute_forward_elu(params, dst);
            } break;
        case GGML_UNARY_OP_RELU:
            {
                ggml_compute_forward_relu(params, dst);
            } break;
        case GGML_UNARY_OP_SIGMOID:
            {
                ggml_compute_forward_sigmoid(params, dst);
            } break;
        case GGML_UNARY_OP_GELU:
            {
                ggml_compute_forward_gelu(params, dst);
            } break;
        case GGML_UNARY_OP_GELU_QUICK:
            {
                ggml_compute_forward_gelu_quick(params, dst);
            } break;
        case GGML_UNARY_OP_SILU:
            {
                ggml_compute_forward_silu(params, dst);
            } break;
        case GGML_UNARY_OP_HARDSWISH:
            {
                ggml_compute_forward_hardswish(params, dst);
            } break;
        case GGML_UNARY_OP_HARDSIGMOID:
            {
                ggml_compute_forward_hardsigmoid(params, dst);
            } break;
        case GGML_UNARY_OP_EXP:
            {
                ggml_compute_forward_exp(params, dst);
            } break;
        default:
            {
                GGML_ABORT("fatal error");
            }
    }
}